

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  byte *srcBuffer;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  sbyte sVar5;
  undefined1 *puVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  undefined1 *puVar18;
  int iVar19;
  ulong uVar20;
  ulong *puVar21;
  int iVar22;
  undefined1 *puVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 *puVar27;
  bool bVar28;
  ulong uStack_128;
  ulong uStack_120;
  ulong *puStack_110;
  ulong *puStack_108;
  size_t sStack_100;
  BIT_DStream_t BStack_f8;
  undefined1 *puStack_d0;
  undefined1 *puStack_c8;
  ulong *puStack_c0;
  size_t *psStack_b8;
  ulong *puStack_b0;
  int iStack_a4;
  ulong uStack_a0;
  undefined1 *puStack_98;
  undefined1 *puStack_90;
  size_t sStack_88;
  ulong *puStack_80;
  ulong *puStack_78;
  ulong *puStack_70;
  undefined1 *puStack_68;
  ulong *puStack_60;
  ulong *puStack_58;
  ulong uStack_50;
  undefined1 *puStack_48;
  size_t *psStack_40;
  ulong uStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar10 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar10;
  }
  if (bmi2 != 0) {
    sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar2 = *cSrc;
  uVar20 = (ulong)uVar2;
  uVar3 = *(ushort *)((long)cSrc + 2);
  uVar15 = (ulong)uVar3;
  uVar4 = *(ushort *)((long)cSrc + 4);
  uVar9 = (ulong)uVar4;
  uVar17 = uVar20 + uVar15 + uVar9 + 6;
  if (cSrcSize < uVar17) {
    return 0xffffffffffffffec;
  }
  puStack_60 = (ulong *)((long)cSrc + uVar20 + 6);
  if (uVar20 == 0) {
    uVar13 = 0xffffffffffffffb8;
    puStack_b0 = (ulong *)0x0;
    puStack_58 = (ulong *)0x0;
    puStack_70 = (ulong *)0x0;
    uVar26 = 0;
    uStack_120 = 0;
  }
  else {
    puStack_58 = (ulong *)((long)cSrc + 6);
    puStack_70 = (ulong *)((long)cSrc + 0xe);
    if (7 < uVar2) {
      uStack_120 = *(ulong *)((long)cSrc + (uVar20 - 2));
      bVar11 = *(byte *)((long)cSrc + uVar20 + 5);
      uVar25 = 0x1f;
      if (bVar11 != 0) {
        for (; bVar11 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = ~uVar25 + 9;
      if (bVar11 == 0) {
        uVar25 = 0;
      }
      uVar26 = (ulong)uVar25;
      uVar13 = uVar20 | -(ulong)(bVar11 == 0);
      puStack_b0 = (ulong *)((long)cSrc + (uVar20 - 2));
      goto LAB_001619ff;
    }
    uStack_120 = (ulong)*(byte *)puStack_58;
    switch(uVar2) {
    case 2:
      goto LAB_001619b8;
    case 3:
      goto LAB_001619ae;
    case 4:
      goto LAB_001619a4;
    case 5:
      goto LAB_00161999;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      break;
    default:
      goto switchD_00161959_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
LAB_00161999:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
LAB_001619a4:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_001619ae:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_001619b8:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
switchD_00161959_default:
    bVar11 = *(byte *)((long)cSrc + uVar20 + 5);
    uVar25 = 0x1f;
    if (bVar11 != 0) {
      for (; bVar11 >> uVar25 == 0; uVar25 = uVar25 - 1) {
      }
    }
    if (bVar11 == 0) {
      uVar13 = 0xffffffffffffffec;
      uVar25 = 0;
    }
    else {
      uVar25 = ~uVar25 + 9 + ((uint)uVar2 * -8 + 0x40 & 0xffff);
      uVar13 = uVar20;
    }
    uVar26 = (ulong)uVar25;
    puStack_b0 = puStack_58;
  }
LAB_001619ff:
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  puStack_c0 = (ulong *)((long)puStack_60 + uVar15);
  if (uVar15 == 0) {
    uVar15 = 0xffffffffffffffb8;
    uVar13 = 0;
    uVar25 = 0;
    puStack_108 = (ulong *)0x0;
    puStack_60 = (ulong *)0x0;
    puStack_78 = (ulong *)0x0;
  }
  else {
    puStack_78 = (ulong *)((long)cSrc + uVar20 + 0xe);
    if (uVar3 < 8) {
      uVar13 = (ulong)(byte)*puStack_60;
      switch(uVar3) {
      case 7:
        uVar13 = uVar13 | (ulong)*(byte *)((long)cSrc + uVar20 + 0xc) << 0x30;
      case 6:
        uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + uVar20 + 0xb) << 0x28);
      case 5:
        uVar13 = uVar13 + ((ulong)*(byte *)((long)cSrc + uVar20 + 10) << 0x20);
      case 4:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + uVar20 + 9) * 0x1000000;
      case 3:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + uVar20 + 8) * 0x10000;
      case 2:
        uVar13 = uVar13 + (ulong)*(byte *)((long)cSrc + uVar20 + 7) * 0x100;
      default:
        bVar11 = *(byte *)((long)puStack_c0 + -1);
        uVar25 = 0x1f;
        if (bVar11 != 0) {
          for (; bVar11 >> uVar25 == 0; uVar25 = uVar25 - 1) {
          }
        }
        puStack_108 = puStack_60;
        if (bVar11 == 0) {
          uVar15 = 0xffffffffffffffec;
          uVar25 = 0;
        }
        else {
          uVar25 = ~uVar25 + 9 + ((uint)uVar3 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      uVar13 = puStack_c0[-1];
      bVar11 = *(byte *)((long)puStack_c0 + -1);
      uVar25 = 0x1f;
      if (bVar11 != 0) {
        for (; bVar11 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar25 = ~uVar25 + 9;
      if (bVar11 == 0) {
        uVar25 = 0;
      }
      uVar15 = uVar15 | -(ulong)(bVar11 == 0);
      puStack_108 = puStack_c0 + -1;
    }
  }
  if (0xffffffffffffff88 < uVar15) {
    return uVar15;
  }
  srcBuffer = (byte *)(uVar9 + (long)puStack_c0);
  if (uVar9 == 0) {
    uVar9 = 0xffffffffffffffb8;
    uStack_128 = 0;
    uVar24 = 0;
    puStack_110 = (ulong *)0x0;
    puStack_c0 = (ulong *)0x0;
    puStack_80 = (ulong *)0x0;
    goto LAB_00161c83;
  }
  puStack_80 = puStack_c0 + 1;
  if (7 < uVar4) {
    uStack_128 = *(ulong *)(srcBuffer + -8);
    bVar11 = srcBuffer[-1];
    uVar24 = 0x1f;
    if (bVar11 != 0) {
      for (; bVar11 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar24 = ~uVar24 + 9;
    if (bVar11 == 0) {
      uVar24 = 0;
    }
    uVar9 = uVar9 | -(ulong)(bVar11 == 0);
    puStack_110 = (ulong *)(srcBuffer + -8);
    goto LAB_00161c83;
  }
  uStack_128 = (ulong)(byte)*puStack_c0;
  switch(uVar4) {
  case 2:
    goto LAB_00161c34;
  case 3:
    goto LAB_00161c2a;
  case 4:
    goto LAB_00161c20;
  case 5:
    goto LAB_00161c15;
  case 6:
    break;
  case 7:
    uStack_128 = uStack_128 | (ulong)*(byte *)((long)puStack_c0 + 6) << 0x30;
    break;
  default:
    goto switchD_00161bdb_default;
  }
  uStack_128 = uStack_128 + ((ulong)*(byte *)((long)puStack_c0 + 5) << 0x28);
LAB_00161c15:
  uStack_128 = uStack_128 + ((ulong)*(byte *)((long)puStack_c0 + 4) << 0x20);
LAB_00161c20:
  uStack_128 = uStack_128 + (ulong)*(byte *)((long)puStack_c0 + 3) * 0x1000000;
LAB_00161c2a:
  uStack_128 = uStack_128 + (ulong)*(byte *)((long)puStack_c0 + 2) * 0x10000;
LAB_00161c34:
  uStack_128 = uStack_128 + (ulong)*(byte *)((long)puStack_c0 + 1) * 0x100;
switchD_00161bdb_default:
  bVar11 = srcBuffer[-1];
  uVar24 = 0x1f;
  if (bVar11 != 0) {
    for (; bVar11 >> uVar24 == 0; uVar24 = uVar24 - 1) {
    }
  }
  puStack_110 = puStack_c0;
  if (bVar11 == 0) {
    uVar9 = 0xffffffffffffffec;
    uVar24 = 0;
  }
  else {
    uVar24 = ~uVar24 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
  }
LAB_00161c83:
  if (0xffffffffffffff88 < uVar9) {
    return uVar9;
  }
  uVar2 = *(ushort *)((long)DTable + 2);
  puStack_c8 = (undefined1 *)dst;
  sStack_88 = maxDstSize;
  sVar10 = BIT_initDStream(&BStack_f8,srcBuffer,cSrcSize - uVar17);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  uStack_a0 = sStack_88 + 3 >> 2;
  puStack_98 = puStack_c8 + uStack_a0;
  puStack_90 = puStack_98 + uStack_a0;
  puStack_48 = puStack_c8 + (sStack_88 - 3);
  puStack_68 = puStack_90 + uStack_a0;
  sStack_100 = BStack_f8.bitContainer;
  cVar7 = (char)uVar2;
  puVar18 = puStack_90;
  puVar23 = puStack_98;
  puVar27 = puStack_c8;
  puVar6 = puStack_68;
  if (puStack_68 < puStack_48) {
    if (cVar7 == '\0') {
LAB_001627ec:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    uVar8 = -(uint)uVar2 & 0x3f;
    uStack_38 = (ulong)uVar8;
    psStack_40 = (size_t *)BStack_f8.limitPtr;
    puStack_d0 = (undefined1 *)(uStack_a0 * 3);
    puVar18 = puStack_c8;
    do {
      puVar27 = puVar18;
      uStack_50 = uVar13;
      sVar5 = (sbyte)uVar8;
      uVar9 = (uStack_120 << ((byte)uVar26 & 0x3f)) >> sVar5;
      uVar20 = (uStack_50 << ((byte)uVar25 & 0x3f)) >> sVar5;
      iVar14 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + (int)uVar26;
      *puVar27 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      uVar9 = (uStack_128 << ((byte)uVar24 & 0x3f)) >> sVar5;
      uVar15 = (sStack_100 << ((byte)BStack_f8.bitsConsumed & 0x3f)) >> sVar5;
      iVar16 = *(byte *)((long)DTable + uVar20 * 2 + 5) + uVar25;
      uVar13 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> sVar5;
      uVar17 = (uStack_50 << ((byte)iVar16 & 0x3f)) >> sVar5;
      puVar27[uStack_a0] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iStack_a4 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar24;
      puVar27[uStack_a0 * 2] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      iVar22 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_f8.bitsConsumed;
      puVar27[(long)puStack_d0] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
      iVar14 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar14;
      puVar27[1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar9 = (uStack_128 << ((byte)iStack_a4 & 0x3f)) >> sVar5;
      uVar15 = (sStack_100 << ((byte)iVar22 & 0x3f)) >> sVar5;
      iVar16 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 5) + iVar16;
      uVar20 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> sVar5;
      uVar13 = (uStack_50 << ((byte)iVar16 & 0x3f)) >> sVar5;
      puVar27[uStack_a0 + 1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
      iStack_a4 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iStack_a4;
      puVar27[uStack_a0 * 2 + 1] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      iVar22 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar22;
      puVar27[(long)puStack_d0 + 1] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
      iVar14 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar14;
      puVar27[2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar16 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 5) + iVar16;
      puVar27[uStack_a0 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 4);
      uVar9 = (uStack_128 << ((byte)iStack_a4 & 0x3f)) >> sVar5;
      uVar20 = (sStack_100 << ((byte)iVar22 & 0x3f)) >> sVar5;
      iStack_a4 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iStack_a4;
      uVar15 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> sVar5;
      uVar17 = (uStack_50 << ((byte)iVar16 & 0x3f)) >> sVar5;
      puVar27[uStack_a0 * 2 + 2] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      iVar22 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar22;
      puVar27[(long)puStack_d0 + 2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      uVar25 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar14;
      puVar27[3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
      uVar9 = (uStack_128 << ((byte)iStack_a4 & 0x3f)) >> sVar5;
      bVar11 = *(byte *)((long)DTable + uVar17 * 2 + 5);
      puVar27[uStack_a0 + 3] = *(undefined1 *)((long)DTable + uVar17 * 2 + 4);
      uVar20 = (sStack_100 << ((byte)iVar22 & 0x3f)) >> sVar5;
      bVar1 = *(byte *)((long)DTable + uVar9 * 2 + 5);
      puVar27[uStack_a0 * 2 + 3] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      BStack_f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar22;
      puVar27[(long)puStack_d0 + 3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
      iVar14 = 3;
      psStack_b8 = (size_t *)BStack_f8.ptr;
      if (puStack_b0 < puStack_70) {
        iVar22 = 3;
        puVar21 = puStack_b0;
      }
      else {
        if (0x40 < uVar25) goto LAB_00162824;
        puVar21 = (ulong *)((long)puStack_b0 - (ulong)(uVar25 >> 3));
        uVar25 = uVar25 & 7;
        uStack_120 = *puVar21;
        iVar22 = 0;
      }
      uVar26 = (ulong)uVar25;
      uVar25 = iVar16 + (uint)bVar11;
      uVar13 = uStack_50;
      if (puStack_78 <= puStack_108) {
        if (0x40 < uVar25) goto LAB_00162824;
        puStack_108 = (ulong *)((long)puStack_108 - (ulong)(uVar25 >> 3));
        uVar25 = uVar25 & 7;
        iVar14 = 0;
        uVar13 = *puStack_108;
      }
      uVar24 = iStack_a4 + (uint)bVar1;
      iVar16 = 3;
      puStack_b0 = puVar21;
      if (puStack_110 < puStack_80) {
        iVar19 = 3;
      }
      else {
        if (0x40 < uVar24) goto LAB_00162824;
        puStack_110 = (ulong *)((long)puStack_110 - (ulong)(uVar24 >> 3));
        uVar24 = uVar24 & 7;
        uStack_128 = *puStack_110;
        iVar19 = 0;
      }
      if (BStack_f8.limitPtr <= BStack_f8.ptr) {
        if (0x40 < BStack_f8.bitsConsumed) {
LAB_00162824:
          BStack_f8.bitContainer = sStack_100;
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6a8,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        BStack_f8.ptr = (char *)((long)BStack_f8.ptr - (ulong)(BStack_f8.bitsConsumed >> 3));
        BStack_f8.bitsConsumed = BStack_f8.bitsConsumed & 7;
        sStack_100 = *(size_t *)BStack_f8.ptr;
        iVar16 = 0;
      }
    } while ((puVar27 + (long)puStack_d0 + 4 < puStack_48) &&
            (puVar18 = puVar27 + 4, ((iVar14 == 0 && iVar22 == 0) && iVar19 == 0) && iVar16 == 0));
    puVar27 = puVar27 + 4;
    puVar18 = puVar27 + uStack_a0 * 2;
    puVar23 = puVar27 + uStack_a0;
    puVar6 = puVar27 + (long)puStack_d0;
  }
  puStack_d0 = puVar6;
  BStack_f8.bitContainer = sStack_100;
  if ((puStack_98 < puVar27) || (puStack_90 < puVar23)) {
    return 0xffffffffffffffec;
  }
  if (puStack_68 < puVar18) {
    return 0xffffffffffffffec;
  }
  puStack_c8 = puStack_c8 + sStack_88;
  bVar11 = -cVar7 & 0x3f;
  do {
    uVar8 = (uint)uVar26;
    if (uVar8 < 0x41) {
      if (puStack_b0 < puStack_70) {
        if (puStack_b0 == puStack_58) goto LAB_001621f4;
        bVar28 = puStack_58 <= (ulong *)((long)puStack_b0 - (uVar26 >> 3));
        uVar12 = (int)puStack_b0 - (int)puStack_58;
        if (bVar28) {
          uVar12 = (uint)(uVar26 >> 3);
        }
        uVar8 = uVar8 + uVar12 * -8;
      }
      else {
        uVar12 = (uint)(uVar26 >> 3);
        uVar8 = uVar8 & 7;
        bVar28 = true;
      }
      uVar26 = (ulong)uVar8;
      puStack_b0 = (ulong *)((long)puStack_b0 - (ulong)uVar12);
      uStack_120 = *puStack_b0;
    }
    else {
LAB_001621f4:
      bVar28 = false;
    }
    uVar8 = (uint)uVar26;
    if ((puStack_98 + -3 <= puVar27) || (!bVar28)) {
      if (puStack_98 <= puVar27) goto LAB_0016233a;
      if (cVar7 != '\0') break;
      goto LAB_001627ec;
    }
    if (cVar7 == '\0') goto LAB_001627ec;
    uVar9 = (uStack_120 << ((byte)uVar26 & 0x3f)) >> bVar11;
    iVar14 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar8;
    uVar20 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> bVar11;
    *puVar27 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar14;
    uVar9 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> bVar11;
    puVar27[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar27[2] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    uVar9 = (uStack_120 << ((byte)iVar14 & 0x3f)) >> bVar11;
    uVar26 = (ulong)((uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14);
    puVar27[3] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar27 = puVar27 + 4;
  } while( true );
  do {
    uVar9 = (uStack_120 << ((byte)uVar26 & 0x3f)) >> bVar11;
    uVar8 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + (int)uVar26;
    *puVar27 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar27 = puVar27 + 1;
    uVar26 = (ulong)uVar8;
  } while (puVar27 < puStack_98);
LAB_0016233a:
  do {
    if (uVar25 < 0x41) {
      if (puStack_108 < puStack_78) {
        if (puStack_108 == puStack_60) goto LAB_0016235c;
        bVar28 = puStack_60 <= (ulong *)((long)puStack_108 - (ulong)(uVar25 >> 3));
        uVar12 = (int)puStack_108 - (int)puStack_60;
        if (bVar28) {
          uVar12 = uVar25 >> 3;
        }
        uVar25 = uVar25 + uVar12 * -8;
      }
      else {
        uVar12 = uVar25 >> 3;
        uVar25 = uVar25 & 7;
        bVar28 = true;
      }
      puStack_108 = (ulong *)((long)puStack_108 - (ulong)uVar12);
      uVar13 = *puStack_108;
    }
    else {
LAB_0016235c:
      bVar28 = false;
    }
    if ((puStack_90 + -3 <= puVar23) || (!bVar28)) {
      if (puStack_90 <= puVar23) goto LAB_00162495;
      if (cVar7 != '\0') break;
      goto LAB_001627ec;
    }
    if (cVar7 == '\0') goto LAB_001627ec;
    uVar9 = (uVar13 << ((byte)uVar25 & 0x3f)) >> bVar11;
    iVar14 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar25;
    uVar20 = (uVar13 << ((byte)iVar14 & 0x3f)) >> bVar11;
    *puVar23 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar14;
    uVar9 = (uVar13 << ((byte)iVar14 & 0x3f)) >> bVar11;
    puVar23[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar23[2] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    uVar9 = (uVar13 << ((byte)iVar14 & 0x3f)) >> bVar11;
    uVar25 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar23[3] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar23 = puVar23 + 4;
  } while( true );
  do {
    uVar9 = (uVar13 << ((byte)uVar25 & 0x3f)) >> bVar11;
    uVar25 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar25;
    *puVar23 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar23 = puVar23 + 1;
  } while (puVar23 < puStack_90);
LAB_00162495:
  do {
    if (uVar24 < 0x41) {
      if (puStack_110 < puStack_80) {
        if (puStack_110 == puStack_c0) {
          bVar28 = false;
          goto LAB_00162510;
        }
        bVar28 = puStack_c0 <= (ulong *)((long)puStack_110 - (ulong)(uVar24 >> 3));
        uVar12 = (int)puStack_110 - (int)puStack_c0;
        if (bVar28) {
          uVar12 = uVar24 >> 3;
        }
        uVar24 = uVar24 + uVar12 * -8;
      }
      else {
        uVar12 = uVar24 >> 3;
        uVar24 = uVar24 & 7;
        bVar28 = true;
      }
      puStack_110 = (ulong *)((long)puStack_110 - (ulong)uVar12);
      uStack_128 = *puStack_110;
    }
    else {
      bVar28 = false;
    }
LAB_00162510:
    if ((puStack_68 + -3 <= puVar18) || (!bVar28)) {
      puVar23 = puStack_d0;
      if (puStack_68 <= puVar18) goto LAB_00162608;
      if (cVar7 != '\0') break;
      goto LAB_001627ec;
    }
    if (cVar7 == '\0') goto LAB_001627ec;
    uVar9 = (uStack_128 << ((byte)uVar24 & 0x3f)) >> bVar11;
    iVar14 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar24;
    uVar20 = (uStack_128 << ((byte)iVar14 & 0x3f)) >> bVar11;
    *puVar18 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar14;
    uVar9 = (uStack_128 << ((byte)iVar14 & 0x3f)) >> bVar11;
    puVar18[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar18[2] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    uVar9 = (uStack_128 << ((byte)iVar14 & 0x3f)) >> bVar11;
    uVar24 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar18[3] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar18 = puVar18 + 4;
  } while( true );
  do {
    uVar9 = (uStack_128 << ((byte)uVar24 & 0x3f)) >> bVar11;
    uVar24 = *(byte *)((long)DTable + uVar9 * 2 + 5) + uVar24;
    *puVar18 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar18 = puVar18 + 1;
  } while (puVar18 < puStack_68);
LAB_00162608:
  do {
    if (BStack_f8.bitsConsumed < 0x41) {
      if (BStack_f8.ptr < BStack_f8.limitPtr) {
        if (BStack_f8.ptr == BStack_f8.start) goto LAB_00162612;
        bVar28 = BStack_f8.start <=
                 (size_t *)((long)BStack_f8.ptr - (ulong)(BStack_f8.bitsConsumed >> 3));
        uVar9 = (ulong)(uint)((int)BStack_f8.ptr - (int)BStack_f8.start);
        if (bVar28) {
          uVar9 = (ulong)(BStack_f8.bitsConsumed >> 3);
        }
        BStack_f8.ptr = (char *)((long)BStack_f8.ptr - uVar9);
        BStack_f8.bitsConsumed = BStack_f8.bitsConsumed + (int)uVar9 * -8;
        BStack_f8.bitContainer = *(size_t *)BStack_f8.ptr;
      }
      else {
        BStack_f8.ptr = (char *)((long)BStack_f8.ptr - (ulong)(BStack_f8.bitsConsumed >> 3));
        BStack_f8.bitsConsumed = BStack_f8.bitsConsumed & 7;
        BStack_f8.bitContainer = *(size_t *)BStack_f8.ptr;
        bVar28 = true;
      }
    }
    else {
LAB_00162612:
      bVar28 = false;
    }
    if ((puStack_48 <= puVar23) || (!bVar28)) {
      if (puStack_c8 <= puVar23) goto LAB_0016276e;
      if (cVar7 != '\0') {
        do {
          uVar9 = (BStack_f8.bitContainer << ((byte)BStack_f8.bitsConsumed & 0x3f)) >> bVar11;
          BStack_f8.bitsConsumed = *(byte *)((long)DTable + uVar9 * 2 + 5) + BStack_f8.bitsConsumed;
          *puVar23 = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
          puVar23 = puVar23 + 1;
        } while (puVar23 < puStack_c8);
LAB_0016276e:
        if (BStack_f8.bitsConsumed != 0x40) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (BStack_f8.ptr != BStack_f8.start) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (uVar24 != 0x40) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (puStack_110 != puStack_c0) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (uVar25 != 0x40) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (puStack_108 != puStack_60) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (uVar8 != 0x40) {
          sStack_88 = 0xffffffffffffffec;
        }
        if (puStack_b0 != puStack_58) {
          return 0xffffffffffffffec;
        }
        return sStack_88;
      }
      goto LAB_001627ec;
    }
    if (cVar7 == '\0') goto LAB_001627ec;
    uVar20 = (BStack_f8.bitContainer << ((byte)BStack_f8.bitsConsumed & 0x3f)) >> bVar11;
    iVar14 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_f8.bitsConsumed;
    uVar9 = (BStack_f8.bitContainer << ((byte)iVar14 & 0x3f)) >> bVar11;
    *puVar23 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    uVar20 = (BStack_f8.bitContainer << ((byte)iVar14 & 0x3f)) >> bVar11;
    puVar23[1] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    iVar14 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar14;
    uVar9 = (BStack_f8.bitContainer << ((byte)iVar14 & 0x3f)) >> bVar11;
    puVar23[2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    BStack_f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar14;
    puVar23[3] = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    puVar23 = puVar23 + 4;
  } while( true );
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}